

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O2

void FastPForLib::__pack_tight<27u,false>(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = 0;
  while (uVar3 = uVar2, uVar3 < 0x360) {
    for (iVar4 = 0; uVar2 = uVar3 + iVar4, iVar4 != 0x36; iVar4 = iVar4 + 0x1b) {
      uVar1 = *in;
      uVar5 = uVar2 & 0x1f;
      out[uVar2 >> 5] = out[uVar2 >> 5] | uVar1 << uVar5;
      if (5 < uVar5) {
        out[(ulong)(uVar2 >> 5) + 1] = uVar1 >> ((byte)-(char)uVar5 & 0x1f);
      }
      in = in + 1;
    }
  }
  return;
}

Assistant:

void __pack_tight(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  assert(bit <= 32);
  if (bit == 32) {
    for (int k = 0; k < 32; ++k) {
      out[k] = in[k];
    }
    return;
  }

  if (bit == 16) {
    for (uint32_t outer = 0; outer < 16; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
        *out |= __bitmask<bit, mask>(*(in++)) << inwordpointer;
      ++out;
    }
    return;
  }
  if (bit == 8) {
    for (uint32_t outer = 0; outer < 8; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 8)
        *out |= __bitmask<bit, mask>(*(in++)) << inwordpointer;
      ++out;
    }
    return;
  }
#if !defined(_MSC_VER) && !defined(__INTEL_COMPILER)
  enum { mygcd = gcd(bit, 32) };
#else
  const uint32_t mygcd = gcd(bit, 32);
#endif
  // iterate over bit position of the output
  if ((bit & 1) == 0) {
    for (uint32_t t = 0; t < mygcd; ++t) {
      for (uint32_t pointer = 0; pointer < 32 * bit / mygcd; pointer += bit) {
        uint32_t inword = (pointer % 32);
        const uint32_t v = __bitmask<bit, mask>(*in++);
        out[pointer / 32] |= v << inword;
        if (inword > 32 - bit)
          out[pointer / 32 + 1] = v >> (32 - inword);
      }
      out += bit / mygcd;
    }
  } else {
    for (uint32_t pointer = 0; pointer < 32 * bit;) {
      for (int i = 0; i < 2; ++i, pointer += bit) {
        uint32_t inword = (pointer % 32);
        const uint32_t v = __bitmask<bit, mask>(*in++);
        out[pointer / 32] |= v << inword;
        if (inword > 32 - bit)
          out[pointer / 32 + 1] = v >> (32 - inword);
      }
    }
    out += bit / mygcd;
  }
}